

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.c
# Opt level: O0

char * blogc_sysinfo_get_datetime(void)

{
  time_t tVar1;
  tm *__tp;
  size_t sVar2;
  char local_428 [8];
  char buf [1024];
  tm *t;
  time_t tmp;
  
  tVar1 = time((time_t *)&t);
  if (tVar1 == -1) {
    tmp = 0;
  }
  else {
    __tp = gmtime((time_t *)&t);
    if (__tp == (tm *)0x0) {
      tmp = 0;
    }
    else {
      sVar2 = strftime(local_428,0x400,"%Y-%m-%d %H:%M:%S",__tp);
      if (sVar2 == 0) {
        tmp = 0;
      }
      else {
        tmp = (time_t)bc_strdup(local_428);
      }
    }
  }
  return (char *)tmp;
}

Assistant:

char*
blogc_sysinfo_get_datetime(void)
{
#ifndef HAVE_SYSINFO_DATETIME
    return NULL;
#else
    time_t tmp;
    if (-1 == time(&tmp))
        return NULL;

    struct tm *t = gmtime(&tmp);
    if (t == NULL)
        return NULL;

    char buf[1024];
    if (0 == strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", t))
        return NULL;

    return bc_strdup(buf);
#endif
}